

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

bool GatherInversionSyms(ParseNode *stmt,Symbol *outerVar,ParseNode *innerLoop,
                        ByteCodeGenerator *byteCodeGenerator,SymCheck *symCheck)

{
  int iVar1;
  ParseNode *this;
  ParseNodeBin *pPVar2;
  ParseNodeName *pPVar3;
  ParseNodeVar *pPVar4;
  Symbol *pSVar5;
  
  if (stmt == (ParseNode *)0x0) {
    return true;
  }
  if (stmt->nop == knopVarDecl) {
    pPVar4 = ParseNode::AsParseNodeVar(stmt);
    pSVar5 = pPVar4->sym;
    if (pSVar5 == (Symbol *)0x0) {
      return true;
    }
  }
  else {
    if (stmt->nop != knopAsg) {
      return true;
    }
    pPVar2 = ParseNode::AsParseNodeBin(stmt);
    this = pPVar2->pnode1;
    if (this == (ParseNode *)0x0) {
      return true;
    }
    if (this->nop == knopDot) {
      return false;
    }
    if (this->nop != knopName) {
      return true;
    }
    pPVar3 = ParseNode::AsParseNodeName(this);
    pSVar5 = pPVar3->sym;
    if (pSVar5 == (Symbol *)0x0) {
      return false;
    }
    if ((pSVar5->field_0x42 & 8) != 0) {
      return false;
    }
  }
  iVar1 = symCheck->symCount;
  if (7 < (long)iVar1) {
    return false;
  }
  symCheck->symCount = iVar1 + 1;
  symCheck->syms[iVar1] = pSVar5;
  return true;
}

Assistant:

bool GatherInversionSyms(ParseNode* stmt, Symbol* outerVar, ParseNode* innerLoop, ByteCodeGenerator* byteCodeGenerator, SymCheck* symCheck)
{
    if (stmt != nullptr)
    {
        ParseNode* lhs = nullptr;
        Symbol* auxSym = nullptr;

        if (stmt->nop == knopAsg)
        {
            lhs = stmt->AsParseNodeBin()->pnode1;
        }
        else if (stmt->nop == knopVarDecl)
        {
            auxSym = stmt->AsParseNodeVar()->sym;
        }

        if (lhs != nullptr)
        {
            if (lhs->nop == knopDot)
            {
                return false;
            }

            if (lhs->nop == knopName)
            {
                ParseNodeName * pnodeNameLhs = lhs->AsParseNodeName();
                if ((pnodeNameLhs->sym == nullptr) || (pnodeNameLhs->sym->GetIsGlobal()))
                {
                    return false;
                }
                else
                {
                    auxSym = pnodeNameLhs->sym;
                }
            }
        }

        if (auxSym != nullptr)
        {
            return symCheck->AddSymbol(auxSym);
        }
    }

    return true;
}